

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUICheckBox * __thiscall
irr::gui::CGUIEnvironment::addCheckBox
          (CGUIEnvironment *this,bool checked,rect<int> *rectangle,IGUIElement *parent,s32 id,
          wchar_t *text)

{
  rect<int> rectangle_00;
  IGUICheckBox *pIVar1;
  vector2d<int> in_RCX;
  vector2d<int> in_RDX;
  undefined1 in_SIL;
  CGUICheckBox *in_R9;
  IGUICheckBox *b;
  IGUIElement *parent_00;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 checked_00;
  
  checked_00 = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  pIVar1 = (IGUICheckBox *)operator_new(0x158);
  parent_00 = *(IGUIElement **)in_RDX;
  rectangle_00.LowerRightCorner = in_RDX;
  rectangle_00.UpperLeftCorner = in_RCX;
  CGUICheckBox::CGUICheckBox
            (in_R9,(bool)checked_00,*(IGUIEnvironment **)((long)in_RDX + 8),parent_00,
             CONCAT13(in_SIL,(int3)in_stack_ffffffffffffffb4) & 0x1ffffff,rectangle_00);
  if (in_R9 != (CGUICheckBox *)0x0) {
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])(pIVar1,in_R9);
  }
  IReferenceCounted::drop((IReferenceCounted *)parent_00);
  return pIVar1;
}

Assistant:

IGUICheckBox *CGUIEnvironment::addCheckBox(bool checked, const core::rect<s32> &rectangle, IGUIElement *parent, s32 id, const wchar_t *text)
{
	IGUICheckBox *b = new CGUICheckBox(checked, this,
			parent ? parent : this, id, rectangle);

	if (text)
		b->setText(text);

	b->drop();
	return b;
}